

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# leb128.cc
# Opt level: O3

void wabt::WriteS64Leb128(Stream *stream,uint64_t value,char *desc)

{
  bool bVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  long lVar5;
  uint64_t uVar6;
  uint8_t data [10];
  byte local_a [10];
  
  if ((long)value < 0) {
    if (((long)value >> 7 == 0xffffffffffffffffU & (byte)(((uint)value & 0x40) >> 6)) == 0) {
      lVar5 = 0;
      uVar3 = (long)value >> 7;
      do {
        local_a[lVar5] = (byte)value | 0x80;
        lVar5 = lVar5 + 1;
        value = uVar3 & 0xffffffff;
        uVar4 = (long)uVar3 >> 7;
        uVar2 = uVar3 & 0x40;
        uVar3 = uVar4;
      } while (uVar2 == 0 || uVar4 != 0xffffffffffffffff);
      goto LAB_00155854;
    }
  }
  else if (0x3f < value) {
    lVar5 = 0;
    uVar3 = value & 0xffffffff;
    uVar6 = value;
    do {
      value = uVar6 >> 7;
      local_a[lVar5] = (byte)uVar3 | 0x80;
      lVar5 = lVar5 + 1;
      uVar3 = value & 0xffffffff;
      bVar1 = 0x1fff < uVar6;
      uVar6 = value;
    } while (bVar1);
    goto LAB_00155854;
  }
  lVar5 = 0;
LAB_00155854:
  local_a[lVar5] = (byte)value & 0x7f;
  Stream::WriteData(stream,local_a,lVar5 + 1,desc,No);
  return;
}

Assistant:

void WriteS64Leb128(Stream* stream, uint64_t value, const char* desc) {
  WriteS64Leb128(stream, Bitcast<int64_t>(value), desc);
}